

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

void __thiscall BigNumber::BigNumber(BigNumber *this,int64_t num)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  __type _Var4;
  value_type local_31 [8];
  digit_t digit;
  
  this->_vptr_BigNumber = (_func_int **)&PTR__BigNumber_00106d98;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (num < 0) {
    this->m_symbol = NEGATIVE;
    num = -num;
  }
  else {
    this->m_symbol = POSITIVE;
    if (num == 0) {
      iVar1 = 1;
      num = 0;
      goto LAB_001015ba;
    }
  }
  _Var4 = std::log10<long>(num);
  iVar1 = (int)(_Var4 + 1.0);
LAB_001015ba:
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_31[0] = (value_type)((ulong)num % 10);
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_digits,local_31);
    num = (ulong)num / 10;
  }
  if (1 < iVar1) {
    trim(this);
  }
  return;
}

Assistant:

BigNumber::BigNumber(int64_t num)
{
    if (num<0)
    {
        m_symbol = NEGATIVE;
        num=-num;
    }
    else
        m_symbol = POSITIVE;
    int len = 1;
    if(num!=0)
        len=log10(num)+1;
    for (int i =0; i<len; ++i)
    {
        digit_t digit;
        digit=num%10;
        num=num/10;
        m_digits.push_back(digit);
    }
    if(len>1) {
        trim();
    }
}